

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

DescriptorCache * __thiscall
DescriptorCache::MergeAndDiff
          (DescriptorCache *__return_storage_ptr__,DescriptorCache *this,DescriptorCache *other)

{
  CExtPubKey *pCVar1;
  long lVar2;
  bool bVar3;
  runtime_error *prVar4;
  _Hash_node_base *p_Var5;
  __node_base _Var6;
  long in_FS_OFFSET;
  allocator<char> local_129;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  CExtPubKey xpub;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorCache(__return_storage_ptr__);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_128,&(other->m_parent_xpubs)._M_h);
  for (_Var6._M_nxt = local_128._M_before_begin._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
      _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    xpub.pubkey.vch[0] = 0xff;
    bVar3 = GetCachedParentExtPubKey(this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,&xpub);
    if (bVar3) {
      bVar3 = ::operator!=(&xpub,(CExtPubKey *)((long)&_Var6._M_nxt[1]._M_nxt + 4));
      if (bVar3) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"MergeAndDiff",&local_129);
        std::operator+(&local_d0,&local_f0,
                       ": New cached parent xpub does not match already cached parent xpub");
        std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00abeed3;
      }
    }
    else {
      pCVar1 = (CExtPubKey *)((long)&_Var6._M_nxt[1]._M_nxt + 4);
      CacheParentExtPubKey(this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,pCVar1);
      CacheParentExtPubKey(__return_storage_ptr__,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,pCVar1);
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&local_128,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)other);
  for (_Var6._M_nxt = local_128._M_before_begin._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
      _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
    p_Var5 = _Var6._M_nxt + 4;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      xpub.pubkey.vch[0] = 0xff;
      bVar3 = GetCachedDerivedExtPubKey
                        (this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,*(uint32_t *)&p_Var5[1]._M_nxt,
                         &xpub);
      if (bVar3) {
        bVar3 = ::operator!=(&xpub,(CExtPubKey *)((long)&p_Var5[1]._M_nxt + 4));
        if (bVar3) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"MergeAndDiff",&local_129);
          std::operator+(&local_d0,&local_f0,
                         ": New cached derived xpub does not match already cached derived xpub");
          std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00abeed3;
        }
      }
      else {
        pCVar1 = (CExtPubKey *)((long)&p_Var5[1]._M_nxt + 4);
        CacheDerivedExtPubKey
                  (this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,*(uint32_t *)&p_Var5[1]._M_nxt,pCVar1);
        CacheDerivedExtPubKey
                  (__return_storage_ptr__,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,
                   *(uint32_t *)&p_Var5[1]._M_nxt,pCVar1);
      }
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_128);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_128,&(other->m_last_hardened_xpubs)._M_h);
  _Var6._M_nxt = local_128._M_before_begin._M_nxt;
  do {
    if (_Var6._M_nxt == (_Hash_node_base *)0x0) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_128);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return __return_storage_ptr__;
      }
LAB_00abeed3:
      __stack_chk_fail();
    }
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    xpub.pubkey.vch[0] = 0xff;
    bVar3 = GetCachedLastHardenedExtPubKey(this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,&xpub);
    if (bVar3) {
      bVar3 = ::operator!=(&xpub,(CExtPubKey *)((long)&_Var6._M_nxt[1]._M_nxt + 4));
      if (bVar3) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"MergeAndDiff",&local_129);
        std::operator+(&local_d0,&local_f0,
                       ": New cached last hardened xpub does not match already cached last hardened xpub"
                      );
        std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00abeed3;
      }
    }
    else {
      pCVar1 = (CExtPubKey *)((long)&_Var6._M_nxt[1]._M_nxt + 4);
      CacheLastHardenedExtPubKey(this,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,pCVar1);
      CacheLastHardenedExtPubKey(__return_storage_ptr__,*(uint32_t *)&_Var6._M_nxt[1]._M_nxt,pCVar1)
      ;
    }
    _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
  } while( true );
}

Assistant:

DescriptorCache DescriptorCache::MergeAndDiff(const DescriptorCache& other)
{
    DescriptorCache diff;
    for (const auto& parent_xpub_pair : other.GetCachedParentExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedParentExtPubKey(parent_xpub_pair.first, xpub)) {
            if (xpub != parent_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached parent xpub does not match already cached parent xpub");
            }
            continue;
        }
        CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
        diff.CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
    }
    for (const auto& derived_xpub_map_pair : other.GetCachedDerivedExtPubKeys()) {
        for (const auto& derived_xpub_pair : derived_xpub_map_pair.second) {
            CExtPubKey xpub;
            if (GetCachedDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, xpub)) {
                if (xpub != derived_xpub_pair.second) {
                    throw std::runtime_error(std::string(__func__) + ": New cached derived xpub does not match already cached derived xpub");
                }
                continue;
            }
            CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
            diff.CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
        }
    }
    for (const auto& lh_xpub_pair : other.GetCachedLastHardenedExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedLastHardenedExtPubKey(lh_xpub_pair.first, xpub)) {
            if (xpub != lh_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached last hardened xpub does not match already cached last hardened xpub");
            }
            continue;
        }
        CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
        diff.CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
    }
    return diff;
}